

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.hpp
# Opt level: O0

bool __thiscall
FastqReader<FastqRecord>::next_record(FastqReader<FastqRecord> *this,FastqRecord *rec)

{
  long lVar1;
  ulong uVar2;
  kstream<gzFile_s_*,_FunctorZlib> *in_RSI;
  long in_RDI;
  int l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0xd0) & 1) == 0) {
    do {
      in_stack_ffffffffffffffe4 =
           kstream<gzFile_s_*,_FunctorZlib>::readFastq
                     (in_RSI,(kseq *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x90);
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
      lVar1 = std::__cxx11::string::size();
      *(long *)(in_RDI + 0xc0) = lVar1 + *(long *)(in_RDI + 0xc0);
      uVar2 = std::__cxx11::string::size();
      in_stack_ffffffffffffffd7 = uVar2 < *(uint *)(in_RDI + 0xa8) && -1 < in_stack_ffffffffffffffe4
      ;
    } while ((bool)in_stack_ffffffffffffffd7);
    if (in_stack_ffffffffffffffe4 < 0) {
      *(undefined1 *)(in_RDI + 0xd0) = 1;
    }
    else {
      *(long *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xb8) + 1;
      lVar1 = std::__cxx11::string::size();
      *(long *)(in_RDI + 200) = lVar1 + *(long *)(in_RDI + 200);
    }
    local_1 = -1 < in_stack_ffffffffffffffe4;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool next_record(FileRecord& rec) {
        int l;
        if ( eof_flag) return false;
        {
            do {
                l = (ks->readFastq(seq));
                std::swap(rec.seq, seq.seq);
                std::swap(rec.qual, seq.qual);
                std::swap(rec.name, seq.name);
                std::swap(rec.comment, seq.comment);
                rec.id = numRecords;
                numRecords++;

                stats.totalLength += rec.seq.size();
            } while (rec.seq.size() < params.min_length && l >= 0);
        }
        if (l<0) eof_flag=true;
        else {
            stats.filteredRecords++;
            stats.filteredLength += rec.seq.size();
        }

        return (l >= 0);
    }